

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Choice.cpp
# Opt level: O3

VirtualIterator<Kernel::Clause_*> __thiscall
Inferences::Choice::ResultFn::operator()(ResultFn *this,Term *term)

{
  TermList op;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  uint uVar6;
  Clause *pCVar7;
  undefined8 *puVar8;
  Term *in_RDX;
  AxiomsIterator local_d8;
  DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> local_78;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  uint64_t uStack_38;
  uint64_t local_30;
  uint64_t uStack_28;
  undefined1 local_20;
  
  uVar6 = *(uint *)&in_RDX->field_0xc & 0xfffffff;
  op._content = in_RDX->_args[(ulong)uVar6 - 2]._content;
  if ((op._content & 1) == 0) {
    pCVar7 = createChoiceAxiom(op,(TermList)in_RDX->_args[(ulong)uVar6 - 3]._content);
    *(int *)(DAT_00b521c0 + 0x108) = *(int *)(DAT_00b521c0 + 0x108) + 1;
    puVar8 = (undefined8 *)
             Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    *puVar8 = &PTR__IteratorCore_00b37428;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8[3] = pCVar7;
    *(undefined8 **)this = puVar8;
    *(undefined4 *)(puVar8 + 1) = 1;
  }
  else {
    AxiomsIterator::AxiomsIterator(&local_d8,in_RDX);
    puVar8 = (undefined8 *)::operator_new(0x70,8);
    pEVar5 = local_d8._choiceOps._map._afterLast;
    pEVar4 = local_d8._choiceOps._map._entries;
    uVar3 = local_d8._choiceOps._map._16_8_;
    uVar2 = local_d8._choiceOps._map._8_8_;
    uVar1 = local_d8._choiceOps._map._0_8_;
    local_20 = local_d8._inBetweenNextandHasNext;
    local_30 = local_d8._headSort._content;
    uStack_28 = local_d8._set._content;
    local_40 = local_d8._nextChoiceOperator._content;
    uStack_38 = local_d8._resultSort._content;
    local_50 = local_d8._opApplied._content;
    uStack_48 = local_d8._setApplied._content;
    *puVar8 = &PTR__ProxyIterator_00b37c40;
    local_d8._choiceOps._map._timestamp = 1;
    local_d8._choiceOps._map._size = 0;
    local_d8._choiceOps._map._deleted = 0;
    local_d8._choiceOps._map._capacityIndex = 0;
    puVar8[2] = uVar1;
    puVar8[3] = uVar2;
    local_78._timestamp = 1;
    local_78._size = 0;
    local_78._deleted = 0;
    local_78._capacityIndex = 0;
    local_78._capacity = 0;
    local_d8._choiceOps._map._capacity = 0;
    local_d8._choiceOps._map._nextExpansionOccupancy = 0;
    puVar8[4] = uVar3;
    local_78._nextExpansionOccupancy = 0;
    local_78._entries = (Entry *)0x0;
    local_d8._choiceOps._map._entries = (Entry *)0x0;
    local_d8._choiceOps._map._afterLast = (Entry *)0x0;
    puVar8[5] = pEVar4;
    puVar8[6] = pEVar5;
    local_78._afterLast = (Entry *)0x0;
    *(bool *)(puVar8 + 0xd) = local_d8._inBetweenNextandHasNext;
    puVar8[0xb] = local_d8._headSort._content;
    puVar8[0xc] = local_d8._set._content;
    puVar8[9] = local_d8._nextChoiceOperator._content;
    puVar8[10] = local_d8._resultSort._content;
    puVar8[7] = local_d8._opApplied._content;
    puVar8[8] = local_d8._setApplied._content;
    *(undefined8 **)this = puVar8;
    *(undefined4 *)(puVar8 + 1) = 1;
    Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_78);
    Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               &local_d8);
  }
  return (VirtualIterator<Kernel::Clause_*>)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

VirtualIterator<Clause*> operator() (Term* term){
    TermList op = *term->nthArgument(2);
    if(op.isVar()){
      return pvi(AxiomsIterator(term));
    } else {
      Clause* axiom = createChoiceAxiom(op, *term->nthArgument(3));
      env.statistics->choiceInstances++;
      return pvi(getSingletonIterator(axiom));
    }
  }